

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

uint8_t __thiscall Cache::getByteCopy(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = getBlockId(this,addr);
  if (uVar1 == 0xffffffff) {
    loadBlockFromLowerLevel(this,addr,cycles);
    uVar1 = getBlockId(this,addr);
    if (uVar1 == 0xffffffff) {
      fwrite("Error, data should in top level cache, but it seems not\n",0x38,1,_stderr);
      exit(-1);
    }
  }
  uVar2 = getOffset(this,addr);
  return *(uint8_t *)
          (*(long *)&(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar1].data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + (ulong)uVar2);
}

Assistant:

uint8_t Cache::getByteCopy(uint32_t addr, uint32_t *cycles) {
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        // in cache
        uint32_t offset = this->getOffset(addr);
        return this->blocks[block_id].data[offset];
    }
    this->loadBlockFromLowerLevel(addr, cycles);
    if ((block_id = this->getBlockId(addr)) != -1) {
        uint32_t offset = this->getOffset(addr);
        return this->blocks[block_id].data[offset];
    } else {
        fprintf(stderr, "Error, data should in top level cache, but it seems not\n");
        exit(-1);
    }
}